

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::operationToDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Operation *operations,
          bool useBranch)

{
  undefined1 local_198 [7];
  bool firstOperation;
  ostringstream stream;
  bool useBranch_local;
  Operation *operations_local;
  
  stream._375_1_ = (byte)operations & 1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::operator<<((ostream *)local_198,"Test ");
  if ((*(uint *)this & 4) != 0) {
    std::operator<<((ostream *)local_198,"atomicCounter()");
  }
  if ((*(uint *)this & 1) != 0) {
    std::operator<<((ostream *)local_198,", ");
    std::operator<<((ostream *)local_198," atomicCounterIncrement()");
  }
  if ((*(uint *)this & 2) != 0) {
    std::operator<<((ostream *)local_198,", ");
    std::operator<<((ostream *)local_198," atomicCounterDecrement()");
  }
  if ((stream._375_1_ & 1) == 0) {
    std::operator<<((ostream *)local_198,".");
  }
  else {
    std::operator<<((ostream *)local_198," calls with branches.");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

string operationToDescription (const AtomicCounterTest::Operation& operations, bool useBranch)
{
	std::ostringstream	stream;
	bool				firstOperation = 0;

	stream
	<< "Test ";

	if ((operations & AtomicCounterTest::OPERATION_GET) != 0)
	{
		stream << "atomicCounter()";
		firstOperation = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_INC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterIncrement()";
		firstOperation = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_DEC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterDecrement()";
		firstOperation = false;
	}


	if (useBranch)
		stream << " calls with branches.";
	else
		stream << ".";

	return stream.str();
}